

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::TimedStatement::fromSyntax
          (Compilation *compilation,TimingControlStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TimingControlSyntax *pTVar4;
  undefined4 extraout_var;
  StatementSyntax *pSVar5;
  undefined4 extraout_var_00;
  socklen_t in_ECX;
  socklen_t __len;
  sockaddr *in_RDX;
  Statement *in_RDI;
  SourceRange SVar6;
  TimingControl *in_stack_00000018;
  StatementContext *in_stack_00000020;
  TimedStatement *result;
  Statement *stmt;
  TimingControl *timing;
  Compilation *compilation_00;
  Statement *args_2;
  BumpAllocator *in_stack_ffffffffffffffc0;
  TimedStatement *local_8;
  
  pTVar4 = not_null<slang::syntax::TimingControlSyntax_*>::operator*
                     ((not_null<slang::syntax::TimingControlSyntax_*> *)0x9ef6c6);
  iVar2 = TimingControl::bind((int)pTVar4,in_RDX,__len);
  Statement::StatementContext::observeTiming(in_stack_00000020,in_stack_00000018);
  pSVar5 = not_null<slang::syntax::StatementSyntax_*>::operator*
                     ((not_null<slang::syntax::StatementSyntax_*> *)0x9ef6f5);
  iVar3 = Statement::bind((int)pSVar5,in_RDX,in_ECX);
  compilation_00 = (Compilation *)CONCAT44(extraout_var,iVar2);
  args_2 = (Statement *)CONCAT44(extraout_var_00,iVar3);
  SVar6 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_RDI);
  local_8 = BumpAllocator::
            emplace<slang::ast::TimedStatement,slang::ast::TimingControl&,slang::ast::Statement_const&,slang::SourceRange>
                      (in_stack_ffffffffffffffc0,(TimingControl *)SVar6.endLoc,
                       (Statement *)SVar6.startLoc,(SourceRange *)args_2);
  bVar1 = TimingControl::bad((TimingControl *)CONCAT44(extraout_var,iVar2));
  if ((bVar1) || (bVar1 = Statement::bad((Statement *)CONCAT44(extraout_var_00,iVar3)), bVar1)) {
    local_8 = (TimedStatement *)Statement::badStmt(compilation_00,in_RDI);
  }
  return &local_8->super_Statement;
}

Assistant:

Statement& TimedStatement::fromSyntax(Compilation& compilation,
                                      const TimingControlStatementSyntax& syntax,
                                      const ASTContext& context, StatementContext& stmtCtx) {
    auto& timing = TimingControl::bind(*syntax.timingControl, context);
    stmtCtx.observeTiming(timing);

    auto& stmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<TimedStatement>(timing, stmt, syntax.sourceRange());

    if (timing.bad() || stmt.bad())
        return badStmt(compilation, result);

    return *result;
}